

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O0

void simgui_render(void)

{
  ImDrawList *pIVar1;
  float fVar2;
  ImDrawData *pIVar3;
  ImGuiIO *pIVar4;
  size_t __n;
  size_t __n_00;
  size_t idx_size_1;
  size_t vtx_size_1;
  int scissor_h;
  int scissor_w;
  int scissor_y;
  int scissor_x;
  size_t local_1a8;
  ImDrawCmd *local_1a0;
  ImDrawCmd *pcmd;
  wchar_t cmd_index;
  uint32_t vtx_offset;
  int num_cmds;
  wchar_t base_element;
  ImDrawList *cl_1;
  int local_178;
  wchar_t cl_index_1;
  wchar_t ib_offset;
  wchar_t vb_offset;
  ImTextureID tex_id;
  sg_bindings bind;
  float local_a4;
  float local_a0;
  _simgui_vs_params_t vs_params;
  int fb_height;
  int fb_width;
  float dpi_scale;
  sg_range idx_data;
  sg_range vtx_data;
  void *dst_idx_ptr;
  ImDrawIdx *src_idx_ptr;
  void *dst_vtx_ptr;
  ImDrawVert *src_vtx_ptr;
  size_t idx_size;
  size_t vtx_size;
  ImDrawList *cl;
  wchar_t cl_index;
  wchar_t cmd_list_count;
  size_t all_idx_size;
  size_t all_vtx_size;
  ImGuiIO *io;
  ImDrawData_conflict *draw_data;
  
  igRender();
  pIVar3 = igGetDrawData();
  pIVar4 = igGetIO();
  if ((pIVar3 != (ImDrawData *)0x0) && (pIVar3->CmdListsCount != 0)) {
    all_idx_size = 0;
    _cl_index = (void *)0x0;
    cl._4_4_ = 0;
    for (cl._0_4_ = 0; (int)cl < pIVar3->CmdListsCount; cl._0_4_ = (int)cl + 1) {
      pIVar1 = pIVar3->CmdLists[(int)cl];
      __n = (long)(pIVar1->VtxBuffer).Size * 0x14;
      __n_00 = (long)(pIVar1->IdxBuffer).Size * 2;
      if ((_simgui.vertices.size < all_idx_size + __n) ||
         (_simgui.indices.size < (void *)((long)_cl_index + __n_00))) break;
      if (__n != 0) {
        memcpy((void *)((long)_simgui.vertices.ptr + all_idx_size),(pIVar1->VtxBuffer).Data,__n);
      }
      if (__n_00 != 0) {
        memcpy((void *)((long)_simgui.indices.ptr + (long)_cl_index),(pIVar1->IdxBuffer).Data,__n_00
              );
      }
      all_idx_size = __n + all_idx_size;
      _cl_index = (void *)(__n_00 + (long)_cl_index);
      cl._4_4_ = cl._4_4_ + 1;
    }
    if (cl._4_4_ != 0) {
      sg_push_debug_group("sokol-imgui");
      if (all_idx_size != 0) {
        idx_data.size = (size_t)_simgui.vertices.ptr;
        sg_update_buffer(_simgui.vbuf,(sg_range *)&idx_data.size);
      }
      if (_cl_index != (void *)0x0) {
        _fb_width = _simgui.indices.ptr;
        idx_data.ptr = _cl_index;
        sg_update_buffer(_simgui.ibuf,(sg_range *)&fb_width);
      }
      fVar2 = _simgui.desc.dpi_scale;
      vs_params._pad_8._4_4_ = (BADTYPE)((pIVar4->DisplaySize).x * _simgui.desc.dpi_scale);
      vs_params._pad_8._0_4_ = (BADTYPE)((pIVar4->DisplaySize).y * _simgui.desc.dpi_scale);
      sg_apply_viewport(L'\0',L'\0',vs_params._pad_8._4_4_,vs_params._pad_8._0_4_,true);
      sg_apply_scissor_rect(L'\0',L'\0',vs_params._pad_8._4_4_,vs_params._pad_8._0_4_,true);
      sg_apply_pipeline(_simgui.pip);
      memset(&local_a4,0,0x10);
      local_a4 = (pIVar4->DisplaySize).x;
      local_a0 = (pIVar4->DisplaySize).y;
      bind._168_8_ = &local_a4;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',(sg_range *)(bind.fs_images + 0xb));
      memset(&tex_id,0,0xb0);
      tex_id._4_4_ = _simgui.vbuf.id;
      bind.vertex_buffer_offsets[6] = _simgui.ibuf.id;
      _ib_offset = pIVar4->Fonts->TexID;
      bind.vs_images[10].id = (uint32_t)_ib_offset;
      cl_index_1 = L'\0';
      local_178 = 0;
      for (cl_1._4_4_ = 0; cl_1._4_4_ < cl._4_4_; cl_1._4_4_ = cl_1._4_4_ + 1) {
        _num_cmds = pIVar3->CmdLists[cl_1._4_4_];
        bind.vertex_buffers[6].id = cl_index_1;
        bind.vertex_buffer_offsets[7] = local_178;
        sg_apply_bindings((sg_bindings *)&tex_id);
        vtx_offset = 0;
        cmd_index = (_num_cmds->CmdBuffer).Size;
        pcmd._4_4_ = 0;
        for (pcmd._0_4_ = L'\0'; (wchar_t)pcmd < cmd_index; pcmd._0_4_ = (wchar_t)pcmd + L'\x01') {
          local_1a0 = (_num_cmds->CmdBuffer).Data + (wchar_t)pcmd;
          if (local_1a0->UserCallback == (ImDrawCallback)0x0) {
            if ((_ib_offset != local_1a0->TextureId) || (pcmd._4_4_ != local_1a0->VtxOffset)) {
              _ib_offset = local_1a0->TextureId;
              pcmd._4_4_ = local_1a0->VtxOffset;
              bind.vs_images[10].id = (uint32_t)_ib_offset;
              bind.vertex_buffers[6].id = cl_index_1 + local_1a0->VtxOffset * 0x14;
              sg_apply_bindings((sg_bindings *)&tex_id);
            }
            sg_apply_scissor_rect
                      ((int)((local_1a0->ClipRect).x * fVar2),(int)((local_1a0->ClipRect).y * fVar2)
                       ,(int)(((local_1a0->ClipRect).z - (local_1a0->ClipRect).x) * fVar2),
                       (int)(((local_1a0->ClipRect).w - (local_1a0->ClipRect).y) * fVar2),true);
            sg_draw(vtx_offset,local_1a0->ElemCount,L'\x01');
          }
          else {
            (*local_1a0->UserCallback)(_num_cmds,local_1a0);
            sg_apply_viewport(L'\0',L'\0',vs_params._pad_8._4_4_,vs_params._pad_8._0_4_,true);
            sg_apply_pipeline(_simgui.pip);
            _scissor_y = &local_a4;
            local_1a8 = 0x10;
            sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',(sg_range *)&scissor_y);
            sg_apply_bindings((sg_bindings *)&tex_id);
          }
          vtx_offset = local_1a0->ElemCount + vtx_offset;
        }
        cl_index_1 = (_num_cmds->VtxBuffer).Size * 0x14 + cl_index_1;
        local_178 = (_num_cmds->IdxBuffer).Size * 2 + local_178;
      }
      sg_apply_viewport(L'\0',L'\0',vs_params._pad_8._4_4_,vs_params._pad_8._0_4_,true);
      sg_apply_scissor_rect(L'\0',L'\0',vs_params._pad_8._4_4_,vs_params._pad_8._0_4_,true);
      sg_pop_debug_group();
    }
  }
  return;
}

Assistant:

SOKOL_API_IMPL void simgui_render(void) {
    #if defined(__cplusplus)
        ImGui::Render();
        ImDrawData* draw_data = ImGui::GetDrawData();
        ImGuiIO* io = &ImGui::GetIO();
    #else
        igRender();
        ImDrawData* draw_data = igGetDrawData();
        ImGuiIO* io = igGetIO();
    #endif
    if (0 == draw_data) {
        return;
    }
    if (draw_data->CmdListsCount == 0) {
        return;
    }
    /* copy vertices and indices into an intermediate buffer so that
       they can be updated with a single sg_update_buffer() call each
       (sg_append_buffer() has performance problems on some GL platforms),
       also keep track of valid number of command lists in case of a
       buffer overflow
    */
    size_t all_vtx_size = 0;
    size_t all_idx_size = 0;
    int cmd_list_count = 0;
    for (int cl_index = 0; cl_index < draw_data->CmdListsCount; cl_index++, cmd_list_count++) {
        ImDrawList* cl = draw_data->CmdLists[cl_index];
        const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
        const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);

        /* check for buffer overflow */
        if (((all_vtx_size + vtx_size) > _simgui.vertices.size) ||
            ((all_idx_size + idx_size) > _simgui.indices.size))
        {
            break;
        }

        /* copy vertices and indices into common buffers */
        if (vtx_size > 0) {
            const ImDrawVert* src_vtx_ptr = cl->VtxBuffer.Data;
            void* dst_vtx_ptr = (void*) (((uint8_t*)_simgui.vertices.ptr) + all_vtx_size);
            memcpy(dst_vtx_ptr, src_vtx_ptr, vtx_size);
        }
        if (idx_size > 0) {
            const ImDrawIdx* src_idx_ptr = cl->IdxBuffer.Data;
            void* dst_idx_ptr = (void*) (((uint8_t*)_simgui.indices.ptr) + all_idx_size);
            memcpy(dst_idx_ptr, src_idx_ptr, idx_size);
        }
        all_vtx_size += vtx_size;
        all_idx_size += idx_size;
    }
    if (0 == cmd_list_count) {
        return;
    }

    /* update the sokol-gfx vertex- and index-buffer */
    sg_push_debug_group("sokol-imgui");
    if (all_vtx_size > 0) {
        sg_range vtx_data = _simgui.vertices;
        vtx_data.size = all_vtx_size;
        sg_update_buffer(_simgui.vbuf, &vtx_data);
    }
    if (all_idx_size > 0) {
        sg_range idx_data = _simgui.indices;
        idx_data.size = all_idx_size;
        sg_update_buffer(_simgui.ibuf, &idx_data);
    }

    /* render the ImGui command list */
    const float dpi_scale = _simgui.desc.dpi_scale;
    const int fb_width = (int) (io->DisplaySize.x * dpi_scale);
    const int fb_height = (int) (io->DisplaySize.y * dpi_scale);
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);

    sg_apply_pipeline(_simgui.pip);
    _simgui_vs_params_t vs_params;
    memset((void*)&vs_params, 0, sizeof(vs_params));
    vs_params.disp_size.x = io->DisplaySize.x;
    vs_params.disp_size.y = io->DisplaySize.y;
    sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
    sg_bindings bind;
    memset((void*)&bind, 0, sizeof(bind));
    bind.vertex_buffers[0] = _simgui.vbuf;
    bind.index_buffer = _simgui.ibuf;
    ImTextureID tex_id = io->Fonts->TexID;
    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
    int vb_offset = 0;
    int ib_offset = 0;
    for (int cl_index = 0; cl_index < cmd_list_count; cl_index++) {
        const ImDrawList* cl = draw_data->CmdLists[cl_index];

        bind.vertex_buffer_offsets[0] = vb_offset;
        bind.index_buffer_offset = ib_offset;
        sg_apply_bindings(&bind);

        int base_element = 0;
        #if defined(__cplusplus)
            const int num_cmds = cl->CmdBuffer.size();
        #else
            const int num_cmds = cl->CmdBuffer.Size;
        #endif
        uint32_t vtx_offset = 0;
        for (int cmd_index = 0; cmd_index < num_cmds; cmd_index++) {
            ImDrawCmd* pcmd = &cl->CmdBuffer.Data[cmd_index];
            if (pcmd->UserCallback) {
                pcmd->UserCallback(cl, pcmd);
                // need to re-apply all state after calling a user callback
                sg_apply_viewport(0, 0, fb_width, fb_height, true);
                sg_apply_pipeline(_simgui.pip);
                sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
                sg_apply_bindings(&bind);
            }
            else {
                if ((tex_id != pcmd->TextureId) || (vtx_offset != pcmd->VtxOffset)) {
                    tex_id = pcmd->TextureId;
                    vtx_offset = pcmd->VtxOffset;
                    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
                    bind.vertex_buffer_offsets[0] = vb_offset + (int)(pcmd->VtxOffset * sizeof(ImDrawVert));
                    sg_apply_bindings(&bind);
                }
                const int scissor_x = (int) (pcmd->ClipRect.x * dpi_scale);
                const int scissor_y = (int) (pcmd->ClipRect.y * dpi_scale);
                const int scissor_w = (int) ((pcmd->ClipRect.z - pcmd->ClipRect.x) * dpi_scale);
                const int scissor_h = (int) ((pcmd->ClipRect.w - pcmd->ClipRect.y) * dpi_scale);
                sg_apply_scissor_rect(scissor_x, scissor_y, scissor_w, scissor_h, true);
                sg_draw(base_element, (int)pcmd->ElemCount, 1);
            }
            base_element += (int)pcmd->ElemCount;
        }
        #if defined(__cplusplus)
            const size_t vtx_size = cl->VtxBuffer.size() * sizeof(ImDrawVert);
            const size_t idx_size = cl->IdxBuffer.size() * sizeof(ImDrawIdx);
        #else
            const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
            const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);
        #endif
        vb_offset += (int)vtx_size;
        ib_offset += (int)idx_size;
    }
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);
    sg_pop_debug_group();
}